

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O0

void iterator_uncommited_seeks(void)

{
  fdb_status fVar1;
  int iVar2;
  char *pcVar3;
  fdb_status s_9;
  fdb_status s_8;
  fdb_status s_7;
  fdb_status s_6;
  fdb_status s_5;
  fdb_status s_4;
  fdb_status s_3;
  fdb_status s_2;
  fdb_status s_1;
  fdb_status s;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_doc *rdoc;
  fdb_iterator *it;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_status status;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined2 in_stack_fffffffffffffda8;
  undefined2 uVar4;
  undefined2 in_stack_fffffffffffffdaa;
  undefined2 uVar5;
  undefined4 in_stack_fffffffffffffdac;
  fdb_file_handle *in_stack_fffffffffffffdb0;
  FILE *pFVar6;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  void *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  void *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  fdb_doc **in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  fdb_iterator *local_70 [2];
  fdb_kvs_handle *local_60;
  fdb_status local_58;
  int local_54;
  fdb_config *in_stack_ffffffffffffffc8;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_54 = system("rm -rf  iterator_test* > errorlog.txt");
  fVar1 = fdb_open((fdb_file_handle **)local_10.tv_usec,(char *)local_10.tv_sec,
                   in_stack_ffffffffffffffc8);
  pFVar6 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar6,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfbf);
    iterator_uncommited_seeks::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xfbf,"void iterator_uncommited_seeks()");
  }
  fVar1 = fdb_kvs_open_default
                    (in_stack_fffffffffffffdb0,
                     (fdb_kvs_handle **)
                     CONCAT44(in_stack_fffffffffffffdac,
                              CONCAT22(in_stack_fffffffffffffdaa,in_stack_fffffffffffffda8)),
                     (fdb_kvs_config *)0x1202b6);
  pFVar6 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar6,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfc0);
    iterator_uncommited_seeks::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xfc0,"void iterator_uncommited_seeks()");
  }
  fdb_set_kv((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             in_stack_fffffffffffffde0,CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
             ,in_stack_fffffffffffffdd0,
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  fdb_set_kv((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             in_stack_fffffffffffffde0,CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
             ,in_stack_fffffffffffffdd0,
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  fdb_set_kv((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             in_stack_fffffffffffffde0,CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
             ,in_stack_fffffffffffffdd0,
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  uVar4 = 0;
  uVar5 = 0;
  local_58 = fdb_iterator_init(local_60,local_70,"b",1,(void *)0x0,0,0);
  if (local_58 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfc7);
    iterator_uncommited_seeks::__test_pass = 0;
    if (local_58 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xfc7,"void iterator_uncommited_seeks()");
    }
  }
  fVar1 = fdb_iterator_seek_to_min
                    ((fdb_iterator *)CONCAT44(in_stack_fffffffffffffdac,CONCAT22(uVar5,uVar4)));
  local_58 = fVar1;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pFVar6 = _stderr;
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar6,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfcb);
    iterator_uncommited_seeks::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xfcb,"void iterator_uncommited_seeks()");
  }
  fVar1 = fdb_iterator_get((fdb_iterator *)
                           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           in_stack_fffffffffffffe20);
  pFVar6 = _stderr;
  local_58 = fVar1;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar6,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfcd);
    iterator_uncommited_seeks::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xfcd,"void iterator_uncommited_seeks()");
  }
  iVar2 = memcmp(pvRam0000000000000020,"b",1);
  if (iVar2 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","b",pvRam0000000000000020,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfce);
    iterator_uncommited_seeks::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xfce,"void iterator_uncommited_seeks()");
  }
  fdb_doc_free((fdb_doc *)0x120630);
  fVar1 = fdb_iterator_seek_to_max
                    ((fdb_iterator *)CONCAT44(in_stack_fffffffffffffdac,CONCAT22(uVar5,uVar4)));
  pFVar6 = _stderr;
  local_58 = fVar1;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar1);
    fprintf(pFVar6,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfd4);
    iterator_uncommited_seeks::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xfd4,"void iterator_uncommited_seeks()");
  }
  fVar1 = fdb_iterator_get((fdb_iterator *)
                           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           in_stack_fffffffffffffe20);
  pFVar6 = _stderr;
  local_58 = fVar1;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    iVar2 = memcmp(pvRam0000000000000020,"c",1);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","c",pvRam0000000000000020,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xfd7);
      iterator_uncommited_seeks::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xfd7,"void iterator_uncommited_seeks()");
    }
    fdb_doc_free((fdb_doc *)0x120818);
    fVar1 = fdb_iterator_prev((fdb_iterator *)
                              CONCAT44(in_stack_fffffffffffffdac,CONCAT22(uVar5,uVar4)));
    local_58 = fVar1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pFVar6 = _stderr;
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar6,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xfdd);
      iterator_uncommited_seeks::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xfdd,"void iterator_uncommited_seeks()");
    }
    fVar1 = fdb_iterator_get((fdb_iterator *)
                             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                             in_stack_fffffffffffffe20);
    local_58 = fVar1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pFVar6 = _stderr;
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar6,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xfdf);
      iterator_uncommited_seeks::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xfdf,"void iterator_uncommited_seeks()");
    }
    iVar2 = memcmp(pvRam0000000000000020,"b",1);
    if (iVar2 == 0) {
      fdb_doc_free((fdb_doc *)0x120a00);
      fVar1 = fdb_iterator_next((fdb_iterator *)
                                CONCAT44(in_stack_fffffffffffffdac,CONCAT22(uVar5,uVar4)));
      pFVar6 = _stderr;
      local_58 = fVar1;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcVar3 = fdb_error_msg(fVar1);
        fprintf(pFVar6,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xfe6);
        iterator_uncommited_seeks::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xfe6,"void iterator_uncommited_seeks()");
      }
      fVar1 = fdb_iterator_get((fdb_iterator *)
                               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                               in_stack_fffffffffffffe20);
      local_58 = fVar1;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        iVar2 = memcmp(pvRam0000000000000020,"c",1);
        if (iVar2 == 0) {
          fdb_doc_free((fdb_doc *)0x120be8);
          fdb_iterator_close((fdb_iterator *)
                             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          fdb_close((fdb_file_handle *)CONCAT44(in_stack_fffffffffffffdac,CONCAT22(uVar5,uVar4)));
          fdb_shutdown();
          memleak_end();
          if (iterator_uncommited_seeks::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n","iterator single doc range");
          }
          else {
            fprintf(_stderr,"%s PASSED\n","iterator single doc range");
          }
          return;
        }
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","c",pvRam0000000000000020,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xfe9);
        iterator_uncommited_seeks::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0xfe9,"void iterator_uncommited_seeks()");
      }
      pFVar6 = _stderr;
      pcVar3 = fdb_error_msg(fVar1);
      fprintf(pFVar6,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xfe8);
      iterator_uncommited_seeks::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xfe8,"void iterator_uncommited_seeks()");
    }
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","b",pvRam0000000000000020,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xfe0);
    iterator_uncommited_seeks::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xfe0,"void iterator_uncommited_seeks()");
  }
  pcVar3 = fdb_error_msg(fVar1);
  fprintf(pFVar6,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar3,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0xfd6);
  iterator_uncommited_seeks::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xfd6,"void iterator_uncommited_seeks()");
}

Assistant:

void iterator_uncommited_seeks()
{
    TEST_INIT();

    int r;

    fdb_status status;
    fdb_kvs_handle *db;
    fdb_file_handle *dbfile;
    fdb_iterator *it;
    fdb_doc *rdoc;
    rdoc=NULL;

    memleak_start();

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;
    TEST_STATUS(fdb_open(&dbfile, "./iterator_test1", &fconfig));
    TEST_STATUS(fdb_kvs_open_default(dbfile, &db, &kvs_config));

    fdb_set_kv(db, "a", 1, NULL, 0);
    fdb_set_kv(db, "b", 1, NULL, 0);
    fdb_set_kv(db, "c", 1, NULL, 0);

    status = fdb_iterator_init(db, &it, "b", 1, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // to 'b'
    status = fdb_iterator_seek_to_min(it);
    TEST_STATUS(status);
    status = fdb_iterator_get(it, &rdoc);
    TEST_STATUS(status);
    TEST_CMP(rdoc->key, "b", 1);
    fdb_doc_free(rdoc);
    rdoc=NULL;

    // to 'c'
    status = fdb_iterator_seek_to_max(it);
    TEST_STATUS(status);
    status = fdb_iterator_get(it, &rdoc);
    TEST_STATUS(status);
    TEST_CMP(rdoc->key, "c", 1);
    fdb_doc_free(rdoc);
    rdoc=NULL;

    // to 'b'
    status = fdb_iterator_prev(it);
    TEST_STATUS(status);
    status = fdb_iterator_get(it, &rdoc);
    TEST_STATUS(status);
    TEST_CMP(rdoc->key, "b", 1);
    fdb_doc_free(rdoc);
    rdoc=NULL;

    // to 'c'
    status = fdb_iterator_next(it);
    TEST_STATUS(status);
    status = fdb_iterator_get(it, &rdoc);
    TEST_STATUS(status);
    TEST_CMP(rdoc->key, "c", 1);
    fdb_doc_free(rdoc);
    rdoc=NULL;

    fdb_iterator_close(it);

    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("iterator single doc range");
}